

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

bool Diligent::
     UpdateBoundObject<GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLSamplerCreateReleaseHelper>>
               (UniqueIdentifier *CurrentObjectID,
               GLObjWrapper<GLObjectWrappers::GLSamplerCreateReleaseHelper> *NewObject,
               GLuint *NewGLHandle)

{
  int iVar1;
  GLuint GVar2;
  int local_30;
  UniqueIdentifier NewObjectID;
  GLuint *NewGLHandle_local;
  GLObjWrapper<GLObjectWrappers::GLSamplerCreateReleaseHelper> *NewObject_local;
  UniqueIdentifier *CurrentObjectID_local;
  
  GVar2 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)NewObject);
  *NewGLHandle = GVar2;
  if (*NewGLHandle == 0) {
    local_30 = 0;
  }
  else {
    local_30 = GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLSamplerCreateReleaseHelper>::
               GetUniqueID(NewObject);
  }
  iVar1 = *CurrentObjectID;
  if (iVar1 != local_30) {
    *CurrentObjectID = local_30;
  }
  return iVar1 != local_30;
}

Assistant:

bool UpdateBoundObject(UniqueIdentifier& CurrentObjectID, const ObjectType& NewObject, GLuint& NewGLHandle)
{
    NewGLHandle = static_cast<GLuint>(NewObject);
    // Only ask for the ID if the object handle is non-zero
    // to avoid ID generation for null objects
    UniqueIdentifier NewObjectID = (NewGLHandle != 0) ? NewObject.GetUniqueID() : 0;

    // It is unsafe to use GL handle to keep track of bound textures
    // When a texture is released, GL is free to reuse its handle for
    // the new created textures
    if (CurrentObjectID != NewObjectID)
    {
        CurrentObjectID = NewObjectID;
        return true;
    }
    return false;
}